

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CleanupCompaction(DBImpl *this,CompactionState *compact)

{
  TableBuilder *this_00;
  Output *pOVar1;
  reference __x;
  Output *out;
  size_t i;
  CompactionState *compact_local;
  DBImpl *this_local;
  
  port::Mutex::AssertHeld(&this->mutex_);
  if (compact->builder == (TableBuilder *)0x0) {
    if (compact->outfile != (WritableFile *)0x0) {
      __assert_fail("compact->outfile == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                    ,0x311,"void leveldb::DBImpl::CleanupCompaction(CompactionState *)");
    }
  }
  else {
    TableBuilder::Abandon(compact->builder);
    this_00 = compact->builder;
    if (this_00 != (TableBuilder *)0x0) {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
  }
  if (compact->outfile != (WritableFile *)0x0) {
    (*compact->outfile->_vptr_WritableFile[1])();
  }
  for (out = (Output *)0x0;
      pOVar1 = (Output *)
               std::
               vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
               ::size(&compact->outputs), out < pOVar1; out = (Output *)((long)&out->number + 1)) {
    __x = std::
          vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
          ::operator[](&compact->outputs,(size_type)out);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              (&this->pending_outputs_,&__x->number);
  }
  if (compact != (CompactionState *)0x0) {
    CompactionState::~CompactionState(compact);
    operator_delete(compact);
  }
  return;
}

Assistant:

void DBImpl::CleanupCompaction(CompactionState* compact) {
  mutex_.AssertHeld();
  if (compact->builder != nullptr) {
    // May happen if we get a shutdown call in the middle of compaction
    compact->builder->Abandon();
    delete compact->builder;
  } else {
    assert(compact->outfile == nullptr);
  }
  delete compact->outfile;
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    pending_outputs_.erase(out.number);
  }
  delete compact;
}